

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es32cRobustnessTests.cpp
# Opt level: O2

bool __thiscall
es32cts::RobustBufferAccessBehavior::ReadnPixelsTest::verifyError
          (ReadnPixelsTest *this,GLint error,GLint expectedError,char *method)

{
  ostringstream *this_00;
  undefined1 local_1a0 [384];
  
  if (error != expectedError) {
    local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Test failed! ");
    std::operator<<((ostream *)this_00,method);
    std::operator<<((ostream *)this_00," throws unexpected error [");
    std::ostream::operator<<(this_00,error);
    std::operator<<((ostream *)this_00,"].");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return error == expectedError;
}

Assistant:

bool ReadnPixelsTest::verifyError(GLint error, GLint expectedError, const char* method)
{
	if (error != expectedError)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Test failed! " << method << " throws unexpected error ["
						   << error << "]." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}